

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

bool google::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,size_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Xword EVar1;
  Elf64_Addr EVar2;
  Elf64_Off EVar3;
  Elf64_Xword EVar4;
  Elf64_Xword EVar5;
  Elf64_Word EVar6;
  Elf64_Word EVar7;
  Elf64_Word EVar8;
  Elf64_Word EVar9;
  Elf64_Word *pEVar10;
  ulong uVar11;
  long lVar12;
  size_t count;
  Elf64_Word *pEVar13;
  ulong uVar14;
  undefined6 in_register_00000032;
  ulong uVar15;
  Elf64_Shdr buf [16];
  undefined1 local_438 [4];
  Elf64_Word aEStack_434 [257];
  
  uVar14 = CONCAT62(in_register_00000032,sh_num) & 0xffffffff;
  uVar15 = 0;
  while( true ) {
    lVar12 = uVar14 - uVar15;
    if (uVar14 < uVar15 || lVar12 == 0) {
      return false;
    }
    count = lVar12 * 0x40;
    if (0x3ff < count) {
      count = 0x400;
    }
    uVar11 = ReadFromOffset(fd,local_438,count,uVar15 * 0x40 + sh_offset);
    if (uVar11 == 0xffffffffffffffff) break;
    if (((uVar11 & 0x3f) != 0) || (0x43f < uVar11)) {
      abort();
    }
    lVar12 = (uVar11 >> 6) + 1;
    pEVar10 = aEStack_434;
    while (pEVar13 = pEVar10, lVar12 = lVar12 + -1, lVar12 != 0) {
      pEVar10 = pEVar13 + 0x10;
      if (*pEVar13 == type) {
        EVar8 = pEVar13[-1];
        EVar9 = pEVar13[0];
        EVar1 = *(Elf64_Xword *)(pEVar13 + 1);
        EVar2 = *(Elf64_Addr *)(pEVar13 + 3);
        EVar3 = *(Elf64_Off *)(pEVar13 + 5);
        EVar4 = *(Elf64_Xword *)(pEVar13 + 7);
        EVar6 = pEVar13[9];
        EVar7 = pEVar13[10];
        EVar5 = *(Elf64_Xword *)(pEVar13 + 0xd);
        out->sh_addralign = *(Elf64_Xword *)(pEVar13 + 0xb);
        out->sh_entsize = EVar5;
        out->sh_size = EVar4;
        out->sh_link = EVar6;
        out->sh_info = EVar7;
        out->sh_addr = EVar2;
        out->sh_offset = EVar3;
        out->sh_name = EVar8;
        out->sh_type = EVar9;
        out->sh_flags = EVar1;
        return true;
      }
    }
    uVar15 = uVar15 + (uVar11 >> 6);
  }
  return false;
}

Assistant:

static ATTRIBUTE_NOINLINE bool GetSectionHeaderByType(const int fd,
                                                      ElfW(Half) sh_num,
                                                      const size_t sh_offset,
                                                      ElfW(Word) type,
                                                      ElfW(Shdr) * out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (size_t i = 0; i < sh_num;) {
    const size_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const size_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    if (len == -1) {
      return false;
    }
    GLOG_SAFE_ASSERT(static_cast<size_t>(len) % sizeof(buf[0]) == 0);
    const size_t num_headers_in_buf = static_cast<size_t>(len) / sizeof(buf[0]);
    GLOG_SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (size_t j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}